

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

void __thiscall
pbrt::FilterSampler::FilterSampler(FilterSampler *this,FilterHandle *filter,Allocator alloc)

{
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *other;
  Tuple2<pbrt::Point2,_float> TVar1;
  int iVar2;
  Bounds2f BVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  short sVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  GaussianFilter *this_00;
  int nv;
  int iVar15;
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  span<const_float> func;
  Point2f p;
  PiecewiseConstant2D local_b0;
  
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       *(ulong *)((filter->
                  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                  ).bits & 0xffffffffffff);
  auVar16._8_4_ = 0x80000000;
  auVar16._0_8_ = 0x8000000080000000;
  auVar16._12_4_ = 0x80000000;
  auVar16 = vxorps_avx512vl(auVar18,auVar16);
  auVar19 = vminps_avx(auVar18,auVar16);
  auVar16 = vmaxps_avx(auVar18,auVar16);
  BVar3 = (Bounds2f)vmovlhps_avx(auVar19,auVar16);
  this->domain = BVar3;
  uVar10 = *(ulong *)((filter->
                      super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                      ).bits & 0xffffffffffff);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar10;
  uVar9 = (uint)((float)uVar10 * 32.0);
  auVar16 = vmovshdup_avx(auVar19);
  uVar11 = (uint)(auVar16._0_4_ * 32.0);
  local_b0.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x = (float)((int)uVar9 >> 0x1f & uVar9);
  local_b0.domain.pMin.super_Tuple2<pbrt::Point2,_float>.y = (float)((int)uVar11 >> 0x1f & uVar11);
  uVar14 = 0;
  uVar10 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar10 = uVar14;
  }
  uVar12 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar12 = uVar14;
  }
  local_b0.domain.pMax.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)(uVar10 | uVar12 << 0x20);
  Array2D<float>::Array2D(&this->values,(Bounds2i *)&local_b0,alloc);
  auVar16 = ZEXT816(0) << 0x40;
  (this->distrib).domain.pMin.super_Tuple2<pbrt::Point2,_float>.x = 3.4028235e+38;
  (this->distrib).domain.pMin.super_Tuple2<pbrt::Point2,_float>.y = 3.4028235e+38;
  (this->distrib).domain.pMax.super_Tuple2<pbrt::Point2,_float>.x = -3.4028235e+38;
  (this->distrib).domain.pMax.super_Tuple2<pbrt::Point2,_float>.y = -3.4028235e+38;
  (this->distrib).pConditionalV.alloc.memoryResource = alloc.memoryResource;
  (this->distrib).pConditionalV.ptr = (PiecewiseConstant1D *)auVar16._0_8_;
  (this->distrib).pConditionalV.nAlloc = auVar16._8_8_;
  (this->distrib).pConditionalV.nStored = 0;
  (this->distrib).pMarginal.func.alloc.memoryResource = alloc.memoryResource;
  (this->distrib).pMarginal.func.ptr = (float *)auVar16._0_8_;
  (this->distrib).pMarginal.func.nAlloc = auVar16._8_8_;
  (this->distrib).pMarginal.func.nStored = 0;
  (this->distrib).pMarginal.cdf.alloc.memoryResource = alloc.memoryResource;
  (this->distrib).pMarginal.cdf.ptr = (float *)auVar16._0_8_;
  (this->distrib).pMarginal.cdf.nAlloc = auVar16._8_8_;
  (this->distrib).pMarginal.cdf.nStored = 0;
  (this->distrib).pMarginal.funcInt = 0.0;
  iVar15 = (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
  iVar2 = (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  nv = iVar15 - iVar2;
  if (nv != 0 && iVar2 <= iVar15) {
    do {
      iVar15 = (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
      iVar2 = (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      uVar9 = iVar15 - iVar2;
      iVar13 = (int)uVar14;
      if (uVar9 != 0 && iVar2 <= iVar15) {
        iVar15 = 0;
        do {
          auVar19 = vinsertps_avx(ZEXT416((uint)((float)iVar15 + 0.5)),
                                  ZEXT416((uint)((float)iVar13 + 0.5)),0x10);
          auVar16 = vpinsrd_avx(ZEXT416(uVar9),
                                (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                                (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y,1);
          auVar16 = vcvtdq2ps_avx(auVar16);
          auVar16 = vdivps_avx(auVar19,auVar16);
          auVar22._8_8_ = 0;
          auVar22._0_8_ = (this->domain).pMin.super_Tuple2<pbrt::Point2,_float>;
          TVar1 = (this->domain).pMax.super_Tuple2<pbrt::Point2,_float>;
          auVar24._8_4_ = 0x3f800000;
          auVar24._0_8_ = 0x3f8000003f800000;
          auVar24._12_4_ = 0x3f800000;
          auVar19 = vsubps_avx(auVar24,auVar16);
          auVar20._0_4_ = auVar16._0_4_ * TVar1.x;
          auVar20._4_4_ = auVar16._4_4_ * TVar1.y;
          auVar20._8_4_ = auVar16._8_4_ * 0.0;
          auVar20._12_4_ = auVar16._12_4_ * 0.0;
          auVar16 = vfmadd231ps_fma(auVar20,auVar22,auVar19);
          local_b0.domain.pMin.super_Tuple2<pbrt::Point2,_float> =
               (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar16);
          uVar10 = (filter->
                   super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                   ).bits;
          this_00 = (GaussianFilter *)(uVar10 & 0xffffffffffff);
          sVar8 = (short)(uVar10 >> 0x30);
          if (uVar10 >> 0x30 < 3) {
            if (sVar8 == 2) {
              fVar17 = GaussianFilter::Evaluate(this_00,(Point2f *)&local_b0);
            }
            else {
              auVar5._8_4_ = 0x7fffffff;
              auVar5._0_8_ = 0x7fffffff7fffffff;
              auVar5._12_4_ = 0x7fffffff;
              auVar16 = vandps_avx512vl(ZEXT416((uint)local_b0.domain.pMin.
                                                      super_Tuple2<pbrt::Point2,_float>.x),auVar5);
              fVar17 = 0.0;
              if (auVar16._0_4_ <= (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.x) {
                auVar6._8_4_ = 0x7fffffff;
                auVar6._0_8_ = 0x7fffffff7fffffff;
                auVar6._12_4_ = 0x7fffffff;
                auVar16 = vandps_avx512vl(ZEXT416((uint)local_b0.domain.pMin.
                                                        super_Tuple2<pbrt::Point2,_float>.y),auVar6)
                ;
                uVar4 = vcmpss_avx512f(auVar16,ZEXT416((uint)(this_00->radius).
                                                             super_Tuple2<pbrt::Vector2,_float>.y),2
                                      );
                fVar17 = (float)((uint)((byte)uVar4 & 1) * 0x3f800000);
              }
            }
          }
          else if (uVar10 >> 0x30 == 4) {
            fVar17 = LanczosSincFilter::Evaluate((LanczosSincFilter *)this_00,(Point2f *)&local_b0);
          }
          else if (sVar8 == 3) {
            fVar17 = MitchellFilter::Evaluate((MitchellFilter *)this_00,(Point2f *)&local_b0);
          }
          else {
            auVar21._8_8_ = 0;
            auVar21._0_8_ = (this_00->radius).super_Tuple2<pbrt::Vector2,_float>;
            auVar23._8_8_ = 0;
            auVar23._0_4_ = local_b0.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x;
            auVar23._4_4_ = local_b0.domain.pMin.super_Tuple2<pbrt::Point2,_float>.y;
            auVar7._8_4_ = 0x7fffffff;
            auVar7._0_8_ = 0x7fffffff7fffffff;
            auVar7._12_4_ = 0x7fffffff;
            auVar16 = vandps_avx512vl(auVar23,auVar7);
            auVar16 = vsubps_avx(auVar21,auVar16);
            auVar16 = vmaxps_avx(auVar16,_DAT_00453010);
            auVar19 = vmovshdup_avx(auVar16);
            fVar17 = auVar16._0_4_ * auVar19._0_4_;
          }
          iVar2 = (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
          (this->values).values
          [((iVar13 - (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) *
            ((this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar2) - iVar2) + iVar15
          ] = fVar17;
          iVar15 = iVar15 + 1;
          uVar9 = (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                  (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
        } while (iVar15 < (int)uVar9);
      }
      uVar14 = (ulong)(iVar13 + 1U);
      nv = (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
           (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
    } while ((int)(iVar13 + 1U) < nv);
  }
  iVar15 = (this->values).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
           (this->values).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  func.n = (size_t)(iVar15 * nv);
  func.ptr = (this->values).values;
  PiecewiseConstant2D::PiecewiseConstant2D(&local_b0,func,iVar15,nv,this->domain,alloc);
  (this->distrib).domain.pMin.super_Tuple2<pbrt::Point2,_float> =
       local_b0.domain.pMin.super_Tuple2<pbrt::Point2,_float>;
  (this->distrib).domain.pMax.super_Tuple2<pbrt::Point2,_float> =
       local_b0.domain.pMax.super_Tuple2<pbrt::Point2,_float>;
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  operator=(&(this->distrib).pConditionalV,&local_b0.pConditionalV);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
            (&(this->distrib).pMarginal.func,&local_b0.pMarginal.func);
  other = &local_b0.pMarginal.cdf;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
            (&(this->distrib).pMarginal.cdf,other);
  (this->distrib).pMarginal.funcInt = local_b0.pMarginal.funcInt;
  (this->distrib).pMarginal.min = local_b0.pMarginal.min;
  (this->distrib).pMarginal.max = local_b0.pMarginal.max;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(other);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_b0.pMarginal.func);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  ~vector(&local_b0.pConditionalV);
  return;
}

Assistant:

FilterSampler::FilterSampler(FilterHandle filter, Allocator alloc)
    : domain(Point2f(-filter.Radius()), Point2f(filter.Radius())),
      values(int(32 * filter.Radius().x), int(32 * filter.Radius().y), alloc),
      distrib(alloc) {
    // Tabularize filter function in _values_
    for (int y = 0; y < values.ySize(); ++y)
        for (int x = 0; x < values.xSize(); ++x) {
            Point2f p = domain.Lerp(
                Point2f((x + 0.5f) / values.xSize(), (y + 0.5f) / values.ySize()));
            values(x, y) = filter.Evaluate(p);
        }

    // Compute sampling distribution for filter
    distrib = PiecewiseConstant2D(values, domain, alloc);
}